

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O1

M44f * anon_unknown.dwarf_b5b72::createRandomMat
                 (M44f *__return_storage_ptr__,Rand48 *random,V3f *trans,V3f *rot,V3f *scale)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float (*pafVar4) [4];
  int j;
  long lVar5;
  int k;
  long lVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  V3f s;
  V3f sh;
  V3f r;
  V3f t;
  undefined8 local_c8;
  float local_c0;
  float local_bc;
  float local_b8;
  V3f local_b4;
  float local_a8;
  float local_98;
  double local_88;
  double local_78;
  V3f *local_68;
  V3f *local_60;
  Vec3<float> local_54;
  V3f local_48;
  V3f local_3c;
  
  __return_storage_ptr__->x[0][0] = 1.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->x[0] + 3) = 0;
  __return_storage_ptr__->x[1][1] = 1.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 0xc) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
  __return_storage_ptr__->x[2][2] = 1.0;
  *(undefined8 *)(__return_storage_ptr__->x[2] + 3) = 0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
  __return_storage_ptr__->x[3][3] = 1.0;
  local_68 = rot;
  local_60 = trans;
  getRandTRS(random,&local_3c,&local_48,&local_b4);
  fVar7 = __return_storage_ptr__->x[0][1];
  fVar1 = __return_storage_ptr__->x[0][2];
  fVar2 = __return_storage_ptr__->x[0][3];
  fVar3 = __return_storage_ptr__->x[1][1];
  fVar14 = __return_storage_ptr__->x[1][2];
  fVar15 = __return_storage_ptr__->x[1][3];
  fVar16 = __return_storage_ptr__->x[2][1];
  fVar17 = __return_storage_ptr__->x[2][2];
  fVar8 = __return_storage_ptr__->x[2][3];
  fVar10 = __return_storage_ptr__->x[3][1];
  fVar11 = __return_storage_ptr__->x[3][2];
  fVar12 = __return_storage_ptr__->x[3][3];
  __return_storage_ptr__->x[3][0] =
       local_3c.z * __return_storage_ptr__->x[2][0] +
       local_3c.x * __return_storage_ptr__->x[0][0] + __return_storage_ptr__->x[1][0] * local_3c.y +
       __return_storage_ptr__->x[3][0];
  __return_storage_ptr__->x[3][1] =
       local_3c.z * fVar16 + local_3c.x * fVar7 + fVar3 * local_3c.y + fVar10;
  __return_storage_ptr__->x[3][2] =
       local_3c.z * fVar17 + local_3c.x * fVar1 + fVar14 * local_3c.y + fVar11;
  __return_storage_ptr__->x[3][3] =
       local_3c.z * fVar8 + local_3c.x * fVar2 + fVar15 * local_3c.y + fVar12;
  local_98 = local_48.z;
  local_78._0_4_ = cosf(local_48.z);
  local_a8 = local_48.y;
  local_88._0_4_ = cosf(local_48.y);
  local_bc = local_48.x;
  local_b8 = cosf(local_48.x);
  local_98 = sinf(local_98);
  local_a8 = sinf(local_a8);
  fVar7 = sinf(local_bc);
  fVar19 = local_78._0_4_ * local_88._0_4_;
  fVar21 = local_88._0_4_ * local_98;
  fVar13 = local_78._0_4_ * local_a8 * fVar7 - local_98 * local_b8;
  fVar22 = local_78._0_4_ * local_b8 + local_98 * local_a8 * fVar7;
  fVar20 = local_88._0_4_ * fVar7;
  fVar24 = local_98 * fVar7 + local_b8 * local_78._0_4_ * local_a8;
  fVar18 = local_b8 * local_98 * local_a8 - local_78._0_4_ * fVar7;
  fVar23 = local_88._0_4_ * local_b8;
  fVar7 = __return_storage_ptr__->x[0][0];
  fVar1 = __return_storage_ptr__->x[0][1];
  fVar2 = __return_storage_ptr__->x[0][2];
  fVar3 = __return_storage_ptr__->x[0][3];
  fVar14 = __return_storage_ptr__->x[1][0];
  fVar15 = __return_storage_ptr__->x[1][1];
  fVar16 = __return_storage_ptr__->x[1][2];
  fVar17 = __return_storage_ptr__->x[1][3];
  fVar8 = __return_storage_ptr__->x[2][0];
  fVar10 = __return_storage_ptr__->x[2][1];
  fVar11 = __return_storage_ptr__->x[2][2];
  fVar12 = __return_storage_ptr__->x[2][3];
  __return_storage_ptr__->x[0][0] = (fVar19 * fVar7 + fVar21 * fVar14) - local_a8 * fVar8;
  __return_storage_ptr__->x[0][1] = (fVar19 * fVar1 + fVar21 * fVar15) - local_a8 * fVar10;
  __return_storage_ptr__->x[0][2] = (fVar19 * fVar2 + fVar21 * fVar16) - local_a8 * fVar11;
  __return_storage_ptr__->x[0][3] = (fVar19 * fVar3 + fVar21 * fVar17) - local_a8 * fVar12;
  __return_storage_ptr__->x[1][0] = fVar20 * fVar8 + fVar13 * fVar7 + fVar22 * fVar14;
  __return_storage_ptr__->x[1][1] = fVar20 * fVar10 + fVar13 * fVar1 + fVar22 * fVar15;
  __return_storage_ptr__->x[1][2] = fVar20 * fVar11 + fVar13 * fVar2 + fVar22 * fVar16;
  __return_storage_ptr__->x[1][3] = fVar20 * fVar12 + fVar13 * fVar3 + fVar22 * fVar17;
  __return_storage_ptr__->x[2][0] = fVar23 * fVar8 + fVar24 * fVar7 + fVar18 * fVar14;
  __return_storage_ptr__->x[2][1] = fVar23 * fVar10 + fVar24 * fVar1 + fVar18 * fVar15;
  __return_storage_ptr__->x[2][2] = fVar23 * fVar11 + fVar24 * fVar2 + fVar18 * fVar16;
  __return_storage_ptr__->x[2][3] = fVar23 * fVar12 + fVar24 * fVar3 + fVar18 * fVar17;
  local_78 = (double)Imath_3_2::erand48(random->_state);
  local_88 = (double)Imath_3_2::erand48(random->_state);
  dVar9 = (double)Imath_3_2::erand48(random->_state);
  local_c0 = (float)((1.0 - dVar9) * 1e-06 + dVar9 + dVar9);
  local_c8 = CONCAT44((float)((1.0 - local_88) * 1e-06 + local_88 + local_88),
                      (float)((1.0 - local_78) * 1e-06 + local_78 + local_78));
  lVar5 = 0;
  do {
    dVar9 = (double)Imath_3_2::erand48(random->_state);
    if (0.5 <= (1.0 - dVar9) * 0.0 + dVar9) {
      *(uint *)((long)&local_c8 + lVar5 * 4) = *(uint *)((long)&local_c8 + lVar5 * 4) ^ 0x80000000;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  fVar7 = __return_storage_ptr__->x[0][0];
  fVar1 = __return_storage_ptr__->x[0][1];
  fVar2 = __return_storage_ptr__->x[0][2];
  fVar3 = __return_storage_ptr__->x[0][3];
  fVar14 = __return_storage_ptr__->x[1][0];
  fVar15 = __return_storage_ptr__->x[1][1];
  fVar16 = __return_storage_ptr__->x[1][2];
  fVar17 = __return_storage_ptr__->x[1][3];
  fVar8 = local_c8._4_4_ * fVar7 + local_c0 * fVar14 + __return_storage_ptr__->x[2][0];
  fVar10 = local_c8._4_4_ * fVar1 + local_c0 * fVar15 + __return_storage_ptr__->x[2][1];
  fVar11 = local_c8._4_4_ * fVar2 + local_c0 * fVar16 + __return_storage_ptr__->x[2][2];
  fVar12 = local_c8._4_4_ * fVar3 + local_c0 * fVar17 + __return_storage_ptr__->x[2][3];
  __return_storage_ptr__->x[2][0] = fVar8;
  __return_storage_ptr__->x[2][1] = fVar10;
  __return_storage_ptr__->x[2][2] = fVar11;
  __return_storage_ptr__->x[2][3] = fVar12;
  fVar14 = (float)local_c8 * fVar7 + fVar14;
  fVar15 = (float)local_c8 * fVar1 + fVar15;
  fVar16 = (float)local_c8 * fVar2 + fVar16;
  fVar17 = (float)local_c8 * fVar3 + fVar17;
  __return_storage_ptr__->x[1][0] = fVar14;
  __return_storage_ptr__->x[1][1] = fVar15;
  __return_storage_ptr__->x[1][2] = fVar16;
  __return_storage_ptr__->x[1][3] = fVar17;
  __return_storage_ptr__->x[0][0] = local_b4.x * fVar7;
  __return_storage_ptr__->x[0][1] = local_b4.x * fVar1;
  __return_storage_ptr__->x[0][2] = local_b4.x * fVar2;
  __return_storage_ptr__->x[0][3] = local_b4.x * fVar3;
  __return_storage_ptr__->x[1][0] = local_b4.y * fVar14;
  __return_storage_ptr__->x[1][1] = local_b4.y * fVar15;
  __return_storage_ptr__->x[1][2] = local_b4.y * fVar16;
  __return_storage_ptr__->x[1][3] = local_b4.y * fVar17;
  __return_storage_ptr__->x[2][0] = local_b4.z * fVar8;
  __return_storage_ptr__->x[2][1] = local_b4.z * fVar10;
  __return_storage_ptr__->x[2][2] = local_b4.z * fVar11;
  __return_storage_ptr__->x[2][3] = local_b4.z * fVar12;
  lVar5 = 0;
  pafVar4 = (float (*) [4])__return_storage_ptr__;
  do {
    lVar6 = 0;
    do {
      dVar9 = (double)Imath_3_2::erand48(random->_state);
      (*(float (*) [4])*pafVar4)[lVar6] =
           (float)((1.0 - dVar9) * -1e-07 + dVar9 * 1e-07) + (*(float (*) [4])*pafVar4)[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    lVar5 = lVar5 + 1;
    pafVar4 = pafVar4 + 1;
  } while (lVar5 != 4);
  Imath_3_2::extractSHRT<float>
            (__return_storage_ptr__,scale,&local_54,local_68,local_60,true,Default);
  return __return_storage_ptr__;
}

Assistant:

M44f
createRandomMat (Rand48& random, V3f& trans, V3f& rot, V3f& scale)
{

    M44f M;
    V3f  t, r, s;
    getRandTRS (random, t, r, s);

    M.translate (t);
    M.rotate (r);

    // Shear M.
    V3f h (
        float(random.nextf (0.000001, 2.0)),
        float(random.nextf (0.000001, 2.0)),
        float(random.nextf (0.000001, 2.0)));

    for (int j = 0; j < 3; j++)
        if (random.nextf (0.0, 1.0) >= 0.5) h[j] *= -1;
    M.shear (h);

    M.scale (s);

    //
    // Add a small random error to the elements of M
    //
    for (int j = 0; j < 4; ++j)
        for (int k = 0; k < 3; ++k)
            M[j][k] += float(random.nextf (-1e-7, 1e-7));

    V3f sh;
    extractSHRT (M, scale, sh, rot, trans);

    debug (("Scale   : %f %f %f\n", s[0], s[1], s[2]));
    debug (("Shear   : %f %f %f\n", h[0], h[1], h[2]));
    debug (("Rot     : %f %f %f\n", r[0], r[1], r[2]));
    debug (("Trans   : %f %f %f\n", t[0], t[1], t[2]));

    return M;
}